

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O1

void basic_api_test<ring_buffer_base<short>>(ring_buffer_base<short> *ring)

{
  uint uVar1;
  bool bVar2;
  AssertHelperData *this;
  stringstream *psVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  AssertionResult gtest_ar;
  int rv;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [2];
  AssertHelper local_50;
  AssertionResult local_48;
  int local_34;
  AssertHelper local_30;
  
  local_50.data_._0_4_ = 0x80;
  local_60[0].ptr_._0_4_ = ring->capacity_ + -1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"ring.capacity()","128",(int *)local_60,(int *)&local_50);
  if (local_48.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    local_60[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
               ,0x82,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60[0].ptr_ + 8))();
      }
      local_60[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
  iVar4 = (ring->write_index_).super___atomic_base<int>._M_i;
  local_60[0].ptr_._0_4_ = 0;
  if (iVar4 < iVar8) {
    local_60[0].ptr_._0_4_ = ring->capacity_;
  }
  local_60[0].ptr_._0_4_ = (iVar4 - iVar8) + (int)local_60[0].ptr_;
  local_50.data_ = local_50.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"ring.available_read()","0",(int *)local_60,(int *)&local_50);
  if (local_48.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    local_60[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
               ,0x84,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60[0].ptr_ + 8))();
      }
      local_60[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
  uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
  iVar4 = 0;
  if (iVar8 <= (int)uVar1) {
    iVar4 = ring->capacity_;
  }
  local_60[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar4;
  local_50.data_._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"ring.available_write()","128",(int *)local_60,(int *)&local_50);
  if (local_48.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    local_60[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
               ,0x85,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60[0].ptr_ + 8))();
      }
      local_60[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  iVar8 = 0;
  local_34 = ring_buffer_base<short>::enqueue(ring,(short *)0x0,0x3f);
  local_48.success_ = local_34 == 0x3f;
  local_48.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar4 = (ring->read_index_).super___atomic_base<int>._M_i;
    iVar7 = (ring->write_index_).super___atomic_base<int>._M_i;
    if (iVar7 < iVar4) {
      iVar8 = ring->capacity_;
    }
    local_50.data_._0_4_ = 0x3f;
    local_60[0].ptr_._0_4_ = (iVar7 - iVar4) + iVar8;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_48,"ring.available_read()","63",(int *)local_60,(int *)&local_50);
    if (local_48.success_ == false) {
      psVar3 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar3);
      *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_48.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar8 = 0x8a;
      local_60[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
    }
    else {
      iVar4 = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
      uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
      if (iVar8 <= (int)uVar1) {
        iVar4 = ring->capacity_;
      }
      local_60[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar4;
      local_50.data_._0_4_ = 0x41;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_48,"ring.available_write()","65",(int *)local_60,
                 (int *)&local_50);
      if (local_48.success_ == false) {
        testing::Message::Message((Message *)local_60);
        if (local_48.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar8 = 0x8b;
      }
      else {
        iVar8 = 0;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_34 = ring_buffer_base<short>::enqueue(ring,(short *)0x0,0x41);
        local_60[0].ptr_._0_4_ = 0x41;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_48,"rv","65",&local_34,(int *)local_60);
        if (local_48.success_ == false) {
          testing::Message::Message((Message *)local_60);
          if (local_48.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar8 = 0x8f;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_48.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          iVar4 = (ring->read_index_).super___atomic_base<int>._M_i;
          iVar7 = (ring->write_index_).super___atomic_base<int>._M_i;
          if (iVar7 < iVar4) {
            iVar8 = ring->capacity_;
          }
          local_60[0].ptr_._0_4_ = (iVar7 - iVar4) + iVar8;
          local_50.data_._0_4_ = 0x80;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_48,"ring.available_read()","128",(int *)local_60,
                     (int *)&local_50);
          if (local_48.success_ == false) {
            testing::Message::Message((Message *)local_60);
            if (local_48.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar8 = 0x90;
          }
          else {
            iVar4 = 0;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_48.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
            uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
            if (iVar8 <= (int)uVar1) {
              iVar4 = ring->capacity_;
            }
            local_60[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar4;
            local_50.data_ = local_50.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_48,"ring.available_write()","0",(int *)local_60,
                       (int *)&local_50);
            if (local_48.success_ == false) {
              testing::Message::Message((Message *)local_60);
              if (local_48.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
              }
              iVar8 = 0x91;
            }
            else {
              iVar7 = 0;
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_48.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              iVar8 = (ring->write_index_).super___atomic_base<int>._M_i;
              iVar4 = (ring->read_index_).super___atomic_base<int>._M_i;
              local_34 = 0;
              if (iVar8 != iVar4) {
                iVar5 = 0;
                if (iVar8 < iVar4) {
                  iVar5 = ring->capacity_;
                }
                iVar5 = (iVar8 - iVar4) + iVar5;
                local_34 = 0x3f;
                if (iVar5 < 0x3f) {
                  local_34 = iVar5;
                }
                (ring->read_index_).super___atomic_base<int>._M_i =
                     (iVar4 + local_34) % ring->capacity_;
              }
              iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
              iVar4 = (ring->write_index_).super___atomic_base<int>._M_i;
              if (iVar4 < iVar8) {
                iVar7 = ring->capacity_;
              }
              local_60[0].ptr_._0_4_ = (iVar4 - iVar8) + iVar7;
              local_50.data_._0_4_ = 0x41;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_48,"ring.available_read()","65",(int *)local_60,
                         (int *)&local_50);
              if (local_48.success_ == false) {
                testing::Message::Message((Message *)local_60);
                if (local_48.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                }
                iVar8 = 0x95;
              }
              else {
                iVar4 = 0;
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_48.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                if (iVar8 <= (int)uVar1) {
                  iVar4 = ring->capacity_;
                }
                local_60[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar4;
                local_50.data_._0_4_ = 0x3f;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_48,"ring.available_write()","63",(int *)local_60,
                           (int *)&local_50);
                if (local_48.success_ == false) {
                  testing::Message::Message((Message *)local_60);
                  if (local_48.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  iVar8 = 0x96;
                }
                else {
                  iVar7 = 0;
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_48.message_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  iVar8 = (ring->write_index_).super___atomic_base<int>._M_i;
                  iVar4 = (ring->read_index_).super___atomic_base<int>._M_i;
                  local_34 = 0;
                  if (iVar8 != iVar4) {
                    iVar5 = 0;
                    if (iVar8 < iVar4) {
                      iVar5 = ring->capacity_;
                    }
                    iVar5 = (iVar8 - iVar4) + iVar5;
                    local_34 = 0x41;
                    if (iVar5 < 0x41) {
                      local_34 = iVar5;
                    }
                    (ring->read_index_).super___atomic_base<int>._M_i =
                         (iVar4 + local_34) % ring->capacity_;
                  }
                  iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                  iVar4 = (ring->write_index_).super___atomic_base<int>._M_i;
                  if (iVar4 < iVar8) {
                    iVar7 = ring->capacity_;
                  }
                  local_60[0].ptr_._0_4_ = (iVar4 - iVar8) + iVar7;
                  local_50.data_ = local_50.data_ & 0xffffffff00000000;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_48,"ring.available_read()","0",(int *)local_60,
                             (int *)&local_50);
                  if (local_48.success_ != false) {
                    iVar4 = 0;
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&local_48.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                    uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                    if (iVar8 <= (int)uVar1) {
                      iVar4 = ring->capacity_;
                    }
                    local_60[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar4;
                    local_50.data_._0_4_ = 0x80;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_48,"ring.available_write()","128",(int *)local_60,
                               (int *)&local_50);
                    if (local_48.success_ == false) {
                      testing::Message::Message((Message *)local_60);
                      if (local_48.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar6 = "";
                      }
                      else {
                        pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_50,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                 ,0x9b,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_50,(Message *)local_60);
                      testing::internal::AssertHelper::~AssertHelper(&local_50);
                      if (local_60[0].ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        bVar2 = testing::internal::IsTrue(true);
                        if ((bVar2) &&
                           (local_60[0].ptr_ !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0)) {
                          (**(code **)(*(long *)local_60[0].ptr_ + 8))();
                        }
                        local_60[0].ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)0x0;
                      }
                    }
                    goto LAB_00117943;
                  }
                  testing::Message::Message((Message *)local_60);
                  if (local_48.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  iVar8 = 0x9a;
                }
              }
            }
          }
        }
      }
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
               ,iVar8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60[0].ptr_ + 8))();
      }
      local_60[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  else {
    this = (AssertHelperData *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this);
    *(undefined8 *)((long)&(this->message).c_str_ + *(long *)(*(long *)&this->line + -0x18)) = 0x11;
    local_50.data_ = this;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_60,&local_48,"rv == 63","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
               ,0x89,(char *)local_60[0].ptr_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(local_60[0].ptr_);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
LAB_00117943:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

void basic_api_test(T& ring)
{
  ASSERT_EQ(ring.capacity(), 128);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);

  int rv = ring.enqueue_default(63);

  ASSERT_TRUE(rv == 63);
  ASSERT_EQ(ring.available_read(), 63);
  ASSERT_EQ(ring.available_write(), 65);

  rv = ring.enqueue_default(65);

  ASSERT_EQ(rv, 65);
  ASSERT_EQ(ring.available_read(), 128);
  ASSERT_EQ(ring.available_write(), 0);

  rv = ring.dequeue(nullptr, 63);

  ASSERT_EQ(ring.available_read(), 65);
  ASSERT_EQ(ring.available_write(), 63);

  rv = ring.dequeue(nullptr, 65);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);
}